

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int urlq_getopt_parse(int argc,char **argv,urlq_getopt_t *opts)

{
  char *u;
  byte bVar1;
  int iVar2;
  size_t sz;
  
  do {
    while (iVar2 = getopt_long(argc,argv,"depr:sPRS",options,0), u = _optarg, iVar2 < 0x65) {
      if (iVar2 < 0x53) {
        if (iVar2 == 0x50) {
          bVar1 = *(byte *)opts | 8;
        }
        else {
          if (iVar2 != 0x52) {
            if (iVar2 != -1) {
              return -1;
            }
            return 0;
          }
          bVar1 = *(byte *)opts | 0x20;
        }
      }
      else if (iVar2 == 0x53) {
        bVar1 = *(byte *)opts | 0x10;
      }
      else {
        if (iVar2 != 100) {
          return -1;
        }
        bVar1 = *(byte *)opts & 0xf8 | 3;
      }
LAB_0010348e:
      *(byte *)opts = bVar1;
    }
    if (iVar2 < 0x72) {
      if (iVar2 == 0x65) {
        bVar1 = *(byte *)opts & 0xf8 | 4;
      }
      else {
        if (iVar2 != 0x70) {
          return -1;
        }
        bVar1 = (*(byte *)opts & 0xf8) + 1;
      }
      goto LAB_0010348e;
    }
    if (iVar2 != 0x72) {
      if (iVar2 != 0x73) {
        return -1;
      }
      bVar1 = *(byte *)opts & 0xf8 | 2;
      goto LAB_0010348e;
    }
    sz = strlen(_optarg);
    iVar2 = coda_url::create_absolute(&opts->parent,u,sz,1);
    if (iVar2 != 0) {
      urlq_getopt_parse();
      return -1;
    }
  } while( true );
}

Assistant:

int urlq_getopt_parse(int argc, char **argv, urlq_getopt_t *opts)
{
    int c;

    while (-1 != (c = getopt_long(argc, argv, "depr:sPRS", options, NULL)))
    {
        switch (c)
        {
            case 'd': opts->action = URLQ_DECODE; break;
            case 'e': opts->action = URLQ_ENCODE; break;
            case 'p': opts->action = URLQ_UPARSE; break;
            case 's': opts->action = URLQ_USPLIT; break;

            case 'r':
                if (0 != opts->parent.create_absolute(optarg, strlen(optarg), CODA_URL_FETCHABLE))
                {
                    fprintf(stderr, "%s: can't parse --refer argument: %s\n",
                        argv[0], optarg);

                    return -1;
                }
                break;

            case 'P': opts->domain = 1; break;
            case 'R': opts->uflags |= CODA_URL_SUBDOMAIN; break;
            case 'S': opts->uflags |= CODA_URL_FETCHABLE; break;

            default:
                return -1;
        }
    }

    return 0;
}